

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

void __thiscall ncnn::InnerProduct::InnerProduct(InnerProduct *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffff10;
  
  Layer::Layer(in_stack_ffffffffffffff10);
  *in_RDI = &PTR__InnerProduct_0201a418;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  in_RDI[0x21] = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  in_RDI[0x2a] = 0;
  *(undefined4 *)(in_RDI + 0x2b) = 0;
  *(undefined4 *)((long)in_RDI + 0x15c) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)((long)in_RDI + 0x164) = 0;
  *(undefined4 *)(in_RDI + 0x2d) = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  in_RDI[0x33] = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)((long)in_RDI + 0x1a4) = 0;
  *(undefined4 *)(in_RDI + 0x35) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ac) = 0;
  *(undefined4 *)(in_RDI + 0x36) = 0;
  in_RDI[0x37] = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x39] = 0;
  in_RDI[0x3a] = 0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  in_RDI[0x3c] = 0;
  *(undefined4 *)(in_RDI + 0x3d) = 0;
  *(undefined4 *)((long)in_RDI + 0x1ec) = 0;
  *(undefined4 *)(in_RDI + 0x3e) = 0;
  *(undefined4 *)((long)in_RDI + 500) = 0;
  *(undefined4 *)(in_RDI + 0x3f) = 0;
  in_RDI[0x40] = 0;
  in_RDI[0x41] = 0;
  in_RDI[0x42] = 0;
  in_RDI[0x43] = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  in_RDI[0x45] = 0;
  *(undefined4 *)(in_RDI + 0x46) = 0;
  *(undefined4 *)((long)in_RDI + 0x234) = 0;
  *(undefined4 *)(in_RDI + 0x47) = 0;
  *(undefined4 *)((long)in_RDI + 0x23c) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  in_RDI[0x49] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

InnerProduct::InnerProduct()
{
    one_blob_only = true;
    support_inplace = false;
}